

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_IgnoreMemoryAllocatedOutsideCheckingPeriodComplicatedCase_Test::
~TEST_MemoryLeakDetectorTest_IgnoreMemoryAllocatedOutsideCheckingPeriodComplicatedCase_Test
          (TEST_MemoryLeakDetectorTest_IgnoreMemoryAllocatedOutsideCheckingPeriodComplicatedCase_Test
           *this)

{
  TEST_MemoryLeakDetectorTest_IgnoreMemoryAllocatedOutsideCheckingPeriodComplicatedCase_Test
  *this_local;
  
  ~TEST_MemoryLeakDetectorTest_IgnoreMemoryAllocatedOutsideCheckingPeriodComplicatedCase_Test(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, IgnoreMemoryAllocatedOutsideCheckingPeriodComplicatedCase)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    detector->stopChecking();

    char* mem2 = detector->allocMemory(defaultNewAllocator(), 8);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    detector->clearAllAccounting(mem_leak_period_checking);
    PlatformSpecificFree(mem);
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));

    detector->startChecking();
    char* mem3 = detector->allocMemory(defaultNewAllocator(), 4);
    detector->stopChecking();
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all));

    detector->clearAllAccounting(mem_leak_period_checking);
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));

    detector->clearAllAccounting(mem_leak_period_all);
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_all));
    PlatformSpecificFree(mem2);
    PlatformSpecificFree(mem3);
}